

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_any_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag)

{
  int iVar1;
  size_t local_30;
  size_t header_len;
  CBS_ASN1_TAG *out_tag_local;
  CBS *out_local;
  CBS *cbs_local;
  
  header_len = (size_t)out_tag;
  out_tag_local = (CBS_ASN1_TAG *)out;
  out_local = cbs;
  iVar1 = CBS_get_any_asn1_element(cbs,out,out_tag,&local_30);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (out_tag_local != (CBS_ASN1_TAG *)0x0) {
      iVar1 = CBS_skip((CBS *)out_tag_local,local_30);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x19e,"int CBS_get_any_asn1(CBS *, CBS *, CBS_ASN1_TAG *)");
      }
    }
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_any_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag) {
  size_t header_len;
  if (!CBS_get_any_asn1_element(cbs, out, out_tag, &header_len)) {
    return 0;
  }

  if (out && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}